

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmp_util.c
# Opt level: O0

int OSSL_CMP_print_to_bio
              (BIO *bio,char *component,char *file,int line,OSSL_CMP_severity level,char *msg)

{
  int iVar1;
  BIO *in_RDI;
  int in_R8D;
  undefined8 in_R9;
  char *level_string;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  if (in_R8D == 0) {
    local_38 = "EMERG";
  }
  else {
    if (in_R8D == 1) {
      local_40 = "ALERT";
    }
    else {
      if (in_R8D == 2) {
        local_48 = "CRIT";
      }
      else {
        if (in_R8D == 3) {
          local_50 = "error";
        }
        else {
          if (in_R8D == 4) {
            local_58 = "warning";
          }
          else {
            if (in_R8D == 5) {
              local_60 = "NOTE";
            }
            else {
              if (in_R8D == 6) {
                local_68 = "info";
              }
              else {
                local_68 = "(unknown level)";
                if (in_R8D == 7) {
                  local_68 = "DEBUG";
                }
              }
              local_60 = local_68;
            }
            local_58 = local_60;
          }
          local_50 = local_58;
        }
        local_48 = local_50;
      }
      local_40 = local_48;
    }
    local_38 = local_40;
  }
  iVar1 = BIO_printf(in_RDI,"CMP %s: %s\n",local_38,in_R9);
  return (int)(-1 < iVar1);
}

Assistant:

int OSSL_CMP_print_to_bio(BIO *bio, const char *component, const char *file,
                          int line, OSSL_CMP_severity level, const char *msg)
{
    const char *level_string =
        level == OSSL_CMP_LOG_EMERG ? "EMERG" :
        level == OSSL_CMP_LOG_ALERT ? "ALERT" :
        level == OSSL_CMP_LOG_CRIT ? "CRIT" :
        level == OSSL_CMP_LOG_ERR ? "error" :
        level == OSSL_CMP_LOG_WARNING ? "warning" :
        level == OSSL_CMP_LOG_NOTICE ? "NOTE" :
        level == OSSL_CMP_LOG_INFO ? "info" :
        level == OSSL_CMP_LOG_DEBUG ? "DEBUG" : "(unknown level)";

#ifndef NDEBUG
    if (BIO_printf(bio, "%s:%s:%d:", improve_location_name(component, "CMP"),
                   file, line) < 0)
        return 0;
#endif
    return BIO_printf(bio, OSSL_CMP_LOG_PREFIX"%s: %s\n",
                      level_string, msg) >= 0;
}